

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O0

void msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  uint16_t uVar1;
  long *__ptr;
  size_type sVar2;
  uint local_84;
  uint local_80;
  uint i_4;
  uint i_3;
  uint i_2;
  size_t pos;
  uint i_1;
  uint16_t ch;
  size_t j_1;
  size_t j;
  uint16_t cache [16];
  size_t i;
  size_t *bucketsize;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets_local;
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
  }
  else {
    __ptr = (long *)malloc(0x80000);
    cache[0xc] = 0;
    cache[0xd] = 0;
    cache[0xe] = 0;
    cache[0xf] = 0;
    for (; (ulong)cache._24_8_ < n - (n & 0xf); cache._24_8_ = cache._24_8_ + 0x10) {
      for (j_1 = 0; j_1 < 0x10; j_1 = j_1 + 1) {
        uVar1 = get_char<unsigned_short>(strings[cache._24_8_ + j_1],depth);
        cache[j_1 - 4] = uVar1;
      }
      for (_i_1 = 0; _i_1 < 0x10; _i_1 = _i_1 + 1) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                  (buckets + cache[_i_1 - 4],strings + cache._24_8_ + _i_1);
      }
    }
    for (; (ulong)cache._24_8_ < n; cache._24_8_ = cache._24_8_ + 1) {
      uVar1 = get_char<unsigned_short>(strings[cache._24_8_],depth);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                (buckets + uVar1,strings + cache._24_8_);
    }
    for (pos._0_4_ = 0; (uint)pos < 0x10000; pos._0_4_ = (uint)pos + 1) {
      sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                        (buckets + (uint)pos);
      __ptr[(uint)pos] = sVar2;
    }
    _i_3 = 0;
    for (i_4 = 0; i_4 < 0x10000; i_4 = i_4 + 1) {
      if (__ptr[i_4] != 0) {
        copy<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char**>
                  (buckets + i_4,strings + _i_3);
        _i_3 = __ptr[i_4] + _i_3;
      }
    }
    for (local_80 = 0; local_80 < 0x10000; local_80 = local_80 + 1) {
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear(buckets + local_80);
    }
    _i_3 = *__ptr;
    for (local_84 = 1; local_84 < 0x10000; local_84 = local_84 + 1) {
      if (__ptr[local_84] != 0) {
        if ((local_84 & 0xff) != 0) {
          msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
                    (strings + _i_3,__ptr[local_84],depth + 2,buckets);
        }
        _i_3 = __ptr[local_84] + _i_3;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}